

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O1

void testExistingStreams(string *tempDir)

{
  float *pfVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  Rgba RVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  Rgba *pRVar9;
  int *piVar10;
  ulong uVar11;
  void *pvVar12;
  char *pcVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  ushort uVar16;
  undefined4 uVar17;
  int h;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar18;
  long lVar19;
  half *phVar20;
  half *phVar21;
  int i;
  ushort uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int x;
  uint uVar28;
  long lVar29;
  ushort uVar30;
  uint uVar31;
  long lVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  Compression local_39c;
  Header header;
  half hStack_386;
  half hStack_384;
  half hStack_382;
  ulong local_380;
  ulong local_378;
  ulong *local_370;
  ulong *local_368;
  ofstream *local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  RgbaOutputFile out;
  half hStack_31e;
  half hStack_31c;
  half hStack_31a;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  StdOFStream ofs;
  undefined4 local_2e0;
  undefined1 uStack_2dc;
  undefined1 uStack_2db;
  undefined2 uStack_2da;
  long *local_2b0;
  Array2D<Imf_3_4::Rgba> p1;
  MultiPartOutputFile out_5;
  long local_278 [2];
  ios_base *local_268;
  undefined8 local_260;
  long local_258;
  string *local_250;
  MultiPartOutputFile out_4;
  ofstream os;
  filebuf local_230 [8];
  char local_228 [232];
  ios_base aiStack_140 [272];
  
  local_250 = tempDir;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing reading and writing using existing streams",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_258 = _VTT;
  local_260 = _TypedAttribute;
  local_268 = aiStack_140;
  local_39c = NO_COMPRESSION;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression: ",0xd);
    plVar8 = (long *)std::ostream::operator<<(&std::cout,local_39c);
    cVar5 = std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    iVar23 = (int)cVar5;
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    p1._sizeX = 0xed;
    p1._sizeY = 0x77;
    pRVar9 = (Rgba *)operator_new__(0x37158);
    p1._data = pRVar9;
    anon_unknown.dwarf_156c2f::fillPixels1(&p1,iVar23,h);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    pcVar2 = (local_250->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + local_250->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    _Var3 = __str._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based file:",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove(_Var3._M_p);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,(_Ios_Openmode)_Var3._M_p);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,_Var3._M_p);
    _out = 0;
    hStack_31e._h = 0;
    hStack_31c._h = 0;
    hStack_31a._h = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_39c);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&ofs,&header,WRITE_RGBA,iVar23);
    Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pRVar9,1);
    Imf_3_4::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_4::Header::~Header(&header);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    _os = local_258;
    *(undefined8 *)(&os + *(long *)(local_258 + -0x18)) = local_260;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)_Var3._M_p);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&header,(ifstream *)&os,_Var3._M_p);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar23);
    piVar10 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar23 = *piVar10;
    lVar32 = (long)piVar10[2] - (long)iVar23;
    uVar24 = lVar32 + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar12 + (long)iVar23 * -8 + (long)-iVar7 * uVar24 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar10[1]);
    cVar5 = Imf_3_4::isLossyCompression(local_39c);
    if ((cVar5 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar6)) {
      phVar21 = &pRVar9->a;
      lVar18 = (long)pvVar12 + 6;
      uVar26 = 0;
      do {
        if (-1 < (int)lVar32) {
          uVar11 = 0;
          do {
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -6 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -3]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x14b,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -4 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -2]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x14c,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -2 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -1]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x14d,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x14e,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar11 = uVar11 + 1;
          } while ((uVar24 & 0xffffffff) != uVar11);
        }
        uVar26 = uVar26 + 1;
        phVar21 = phVar21 + 0x1dc;
        lVar18 = lVar18 + uVar24 * 8;
      } while (uVar26 != uVar31);
    }
    operator_delete__(pvVar12);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&header);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_156c2f::MMIFStream::MMIFStream((MMIFStream *)&os,_Var3._M_p);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar23);
    piVar10 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar23 = *piVar10;
    lVar32 = (long)piVar10[2] - (long)iVar23;
    uVar24 = lVar32 + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar12 + (long)iVar23 * -8 + (long)-iVar7 * uVar24 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar10[1]);
    cVar5 = Imf_3_4::isLossyCompression(local_39c);
    if ((cVar5 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar6)) {
      phVar21 = &(p1._data)->a;
      lVar18 = (long)pvVar12 + 6;
      uVar26 = 0;
      do {
        if (-1 < (int)lVar32) {
          uVar11 = 0;
          do {
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -6 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -3]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x16a,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -4 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -2]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x16b,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -2 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -1]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x16c,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x16d,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar11 = uVar11 + 1;
          } while ((uVar24 & 0xffffffff) != uVar11);
        }
        uVar26 = uVar26 + 1;
        phVar21 = phVar21 + p1._sizeY * 4;
        lVar18 = lVar18 + uVar24 * 8;
      } while (uVar26 != uVar31);
    }
    operator_delete__(pvVar12);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    anon_unknown.dwarf_156c2f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped, passthru)",0x23);
    anon_unknown.dwarf_156c2f::MMIFStream::MMIFStream((MMIFStream *)&os,_Var3._M_p);
    Imf_3_4::IStream::IStream((IStream *)&header,"");
    _header = &PTR__IStream_001e6178;
    local_360 = &os;
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar23);
    piVar10 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar23 = *piVar10;
    lVar32 = (long)piVar10[2] - (long)iVar23;
    uVar24 = lVar32 + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar12 + (long)iVar23 * -8 + (long)-iVar7 * uVar24 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar10[1]);
    cVar5 = Imf_3_4::isLossyCompression(local_39c);
    if ((cVar5 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar6)) {
      phVar21 = &(p1._data)->a;
      lVar18 = (long)pvVar12 + 6;
      uVar26 = 0;
      do {
        if (-1 < (int)lVar32) {
          uVar11 = 0;
          do {
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -6 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -3]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x18b,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -4 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -2]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x18c,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -2 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -1]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x18d,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x18e,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar11 = uVar11 + 1;
          } while ((uVar24 & 0xffffffff) != uVar11);
        }
        uVar26 = uVar26 + 1;
        phVar21 = phVar21 + p1._sizeY * 4;
        lVar18 = lVar18 + uVar24 * 8;
      } while (uVar26 != uVar31);
    }
    operator_delete__(pvVar12);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::IStream::~IStream((IStream *)&header);
    anon_unknown.dwarf_156c2f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    remove(_Var3._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based stringstream:",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    _header = (undefined **)&local_378;
    local_380 = 0;
    local_378 = local_378 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    __str._M_dataplus._M_p = (pointer)0x0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&__str,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,iVar23);
    pRVar9 = p1._data;
    Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    Imf_3_4::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_4::Header::~Header((Header *)&ofs);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar23);
    piVar10 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar23 = *piVar10;
    lVar32 = (long)piVar10[2] - (long)iVar23;
    uVar24 = lVar32 + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar12 + (long)iVar23 * -8 + (long)-iVar7 * uVar24 * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar10[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar6) {
      phVar21 = &pRVar9->a;
      lVar18 = (long)pvVar12 + 6;
      uVar26 = 0;
      do {
        if (-1 < (int)lVar32) {
          uVar11 = 0;
          do {
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -6 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -3]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x322,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -4 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -2]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x323,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -2 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -1]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x324,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x325,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar11 = uVar11 + 1;
          } while ((uVar24 & 0xffffffff) != uVar11);
        }
        uVar26 = uVar26 + 1;
        phVar21 = phVar21 + p1._sizeY * 4;
        lVar18 = lVar18 + uVar24 * 8;
      } while (uVar26 != uVar31);
    }
    operator_delete__(pvVar12);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if (_header != (undefined **)&local_378) {
      operator_delete(_header,local_378 + 1);
    }
    lVar18 = p1._sizeY;
    lVar32 = _imath_half_to_float_table;
    phVar21 = &pRVar9->a;
    lVar19 = 0;
    do {
      fVar34 = (float)((uint)lVar19 & 2);
      uVar28 = (uint)fVar34 & 0x7fffff | 0x800000;
      cVar5 = (char)((uint)fVar34 >> 0x17);
      uVar31 = (uint)fVar34 >> 0xd & 0x3ff;
      uVar16 = (ushort)uVar31 | 0x7c00 | (ushort)(uVar31 == 0);
      uVar22 = (ushort)(0x80000000 < uVar28 << (cVar5 + 0xa2U & 0x1f)) +
               (short)(uVar28 >> (0x7eU - cVar5 & 0x1f));
      uVar30 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >> 0xd);
      if (0x477fefff < (uint)fVar34) {
        uVar30 = 0x7c00;
      }
      if (fVar34 == INFINITY) {
        uVar16 = 0x7c00;
      }
      if ((uint)fVar34 < 0x7f800000) {
        uVar16 = uVar30;
      }
      if ((uint)fVar34 < 0x33000001) {
        uVar22 = 0;
      }
      if (0x387fffff < (uint)fVar34) {
        uVar22 = uVar16;
      }
      lVar29 = 0;
      do {
        fVar34 = (float)((uint)lVar29 & 2);
        if ((uint)fVar34 < 0x38800000) {
          if ((uint)fVar34 < 0x33000001) {
            uVar30 = 0;
          }
          else {
            cVar5 = (char)((uint)fVar34 >> 0x17);
            uVar31 = (uint)fVar34 & 0x7fffff | 0x800000;
            uVar30 = (ushort)(uVar31 >> (0x7eU - cVar5 & 0x1f));
            if (0x80000000 < uVar31 << (cVar5 + 0xa2U & 0x1f)) {
              uVar30 = uVar30 + 1;
            }
          }
        }
        else if ((uint)fVar34 < 0x7f800000) {
          if ((uint)fVar34 < 0x477ff000) {
            uVar30 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                             0xd);
          }
          else {
            uVar30 = 0x7c00;
          }
        }
        else {
          uVar30 = 0x7c00;
          if (fVar34 != INFINITY) {
            uVar31 = (uint)fVar34 >> 0xd & 0x3ff;
            uVar30 = (ushort)(uVar31 == 0) | (ushort)uVar31 | 0x7c00;
          }
        }
        fVar34 = (float)((uint)lVar19 + (uint)lVar29 & 2);
        phVar21[lVar29 * 4 + -3]._h = uVar30;
        if ((uint)fVar34 < 0x38800000) {
          if ((uint)fVar34 < 0x33000001) {
            uVar16 = 0;
          }
          else {
            cVar5 = (char)((uint)fVar34 >> 0x17);
            uVar31 = (uint)fVar34 & 0x7fffff | 0x800000;
            uVar16 = (ushort)(uVar31 >> (0x7eU - cVar5 & 0x1f));
            if (0x80000000 < uVar31 << (cVar5 + 0xa2U & 0x1f)) {
              uVar16 = uVar16 + 1;
            }
          }
        }
        else if ((uint)fVar34 < 0x7f800000) {
          if ((uint)fVar34 < 0x477ff000) {
            uVar16 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                             0xd);
          }
          else {
            uVar16 = 0x7c00;
          }
        }
        else {
          uVar16 = 0x7c00;
          if (fVar34 != INFINITY) {
            uVar31 = (uint)fVar34 >> 0xd & 0x3ff;
            uVar16 = (ushort)(uVar31 == 0) | (ushort)uVar31 | 0x7c00;
          }
        }
        phVar21[lVar29 * 4 + -2]._h = uVar16;
        phVar21[lVar29 * 4 + -1]._h = uVar22;
        fVar35 = (*(float *)(lVar32 + (ulong)uVar30 * 4) + *(float *)(lVar32 + (ulong)uVar22 * 4) +
                 *(float *)(lVar32 + (ulong)uVar16 * 4)) / 3.0;
        fVar34 = ABS(fVar35);
        uVar30 = (ushort)((uint)fVar35 >> 0x10) & 0x8000;
        if ((uint)fVar34 < 0x38800000) {
          if ((0x33000000 < (uint)fVar34) &&
             (uVar31 = (uint)fVar34 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar34 >> 0x17),
             uVar30 = uVar30 | (ushort)(uVar31 >> (0x7eU - cVar5 & 0x1f)),
             0x80000000 < uVar31 << (cVar5 + 0xa2U & 0x1f))) {
            uVar30 = uVar30 + 1;
          }
        }
        else if ((uint)fVar34 < 0x7f800000) {
          if ((uint)fVar34 < 0x477ff000) {
            uVar30 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                             0xd) | uVar30;
          }
          else {
            uVar30 = uVar30 | 0x7c00;
          }
        }
        else {
          uVar30 = uVar30 | 0x7c00;
          if (fVar34 != INFINITY) {
            uVar31 = (uint)fVar34 >> 0xd & 0x3ff;
            uVar30 = uVar30 | (ushort)uVar31 | (ushort)(uVar31 == 0);
          }
        }
        phVar21[lVar29 * 4]._h = uVar30;
        lVar29 = lVar29 + 1;
      } while (lVar29 != 0x77);
      lVar19 = lVar19 + 1;
      phVar21 = phVar21 + p1._sizeY * 4;
    } while (lVar19 != 0xed);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    pcVar2 = (local_250->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + local_250->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    _Var3 = __str._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tiled file:",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove(_Var3._M_p);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,(_Ios_Openmode)_Var3._M_p);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,_Var3._M_p);
    _out = 0;
    hStack_31e._h = 0;
    hStack_31c._h = 0;
    hStack_31a._h = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_39c);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&ofs,&header,WRITE_RGBA,0x14,0x14,ONE_LEVEL,
               ROUND_DOWN,iVar23);
    pRVar9 = p1._data;
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar6 = (int)(Rgba *)&out;
    iVar23 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar6);
    iVar7 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar6);
    Imf_3_4::TiledRgbaOutputFile::writeTiles(iVar6,0,iVar23 + -1,0,iVar7 + -1);
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_4::Header::~Header(&header);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    _os = local_258;
    *(undefined8 *)(&os + *(long *)(local_258 + -0x18)) = local_260;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)_Var3._M_p);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,_Var3._M_p);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&header,(IStream *)&ofs,iVar23);
    piVar10 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar23 = *piVar10;
    lVar32 = (long)piVar10[2] - (long)iVar23;
    uVar24 = lVar32 + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&header,(long)pvVar12 + (long)iVar23 * -8 + (long)-iVar7 * uVar24 * 8,1);
    iVar23 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
    iVar7 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
    Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar23 + -1,0,iVar7 + -1);
    cVar5 = Imf_3_4::isLossyCompression(local_39c);
    if ((cVar5 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar6)) {
      phVar21 = &pRVar9->a;
      lVar19 = (long)pvVar12 + 6;
      uVar26 = 0;
      do {
        if (-1 < (int)lVar32) {
          uVar11 = 0;
          do {
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar19 + -6 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -3]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2c2,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar19 + -4 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -2]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2c3,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar19 + -2 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -1]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2c4,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar19 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2c5,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar11 = uVar11 + 1;
          } while ((uVar24 & 0xffffffff) != uVar11);
        }
        uVar26 = uVar26 + 1;
        phVar21 = phVar21 + lVar18 * 4;
        lVar19 = lVar19 + uVar24 * 8;
      } while (uVar26 != uVar31);
    }
    operator_delete__(pvVar12);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_156c2f::MMIFStream::MMIFStream((MMIFStream *)&os,_Var3._M_p);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar23);
    piVar10 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar23 = *piVar10;
    lVar32 = (long)piVar10[2] - (long)iVar23;
    uVar24 = lVar32 + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar12 + (long)iVar23 * -8 + (long)-iVar7 * uVar24 * 8,1);
    iVar23 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&ofs);
    iVar7 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&ofs);
    Imf_3_4::TiledRgbaInputFile::readTiles((int)&ofs,0,iVar23 + -1,0,iVar7 + -1);
    cVar5 = Imf_3_4::isLossyCompression(local_39c);
    if ((cVar5 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar6)) {
      phVar21 = &(p1._data)->a;
      lVar18 = (long)pvVar12 + 6;
      uVar26 = 0;
      do {
        if (-1 < (int)lVar32) {
          uVar11 = 0;
          do {
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -6 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -3]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2e1,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -4 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -2]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2e2,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -2 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -1]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2e3,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2e4,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar11 = uVar11 + 1;
          } while ((uVar24 & 0xffffffff) != uVar11);
        }
        uVar26 = uVar26 + 1;
        phVar21 = phVar21 + p1._sizeY * 4;
        lVar18 = lVar18 + uVar24 * 8;
      } while (uVar26 != uVar31);
    }
    operator_delete__(pvVar12);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    anon_unknown.dwarf_156c2f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    remove(_Var3._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"tiled stringstream:",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    _header = (undefined **)&local_378;
    local_380 = 0;
    local_378 = local_378 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    __str._M_dataplus._M_p = (pointer)0x0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&__str,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,0x14,0x14,
               ONE_LEVEL,ROUND_DOWN,iVar23);
    pRVar9 = p1._data;
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar6 = (int)(Rgba *)&out;
    iVar23 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar6);
    iVar7 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar6);
    Imf_3_4::TiledRgbaOutputFile::writeTiles(iVar6,0,iVar23 + -1,0,iVar7 + -1);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_4::Header::~Header((Header *)&ofs);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar23);
    piVar10 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar23 = *piVar10;
    lVar32 = (long)piVar10[2] - (long)iVar23;
    uVar24 = lVar32 + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar12 + (long)iVar23 * -8 + (long)-iVar7 * uVar24 * 8,1);
    iVar25 = (int)(Rgba *)&ofs;
    iVar23 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar25);
    iVar7 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar25);
    Imf_3_4::TiledRgbaInputFile::readTiles(iVar25,0,iVar23 + -1,0,iVar7 + -1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar6) {
      phVar21 = &pRVar9->a;
      lVar18 = (long)pvVar12 + 6;
      uVar26 = 0;
      do {
        if (-1 < (int)lVar32) {
          uVar11 = 0;
          do {
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -6 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -3]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f3,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -4 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -2]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f4,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + -2 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4 + -1]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f5,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar34 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar18 + uVar11 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar11 * 4]._h * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3f6,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar11 = uVar11 + 1;
          } while ((uVar24 & 0xffffffff) != uVar11);
        }
        uVar26 = uVar26 + 1;
        phVar21 = phVar21 + p1._sizeY * 4;
        lVar18 = lVar18 + uVar24 * 8;
      } while (uVar26 != uVar31);
    }
    operator_delete__(pvVar12);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    cVar5 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    iVar7 = (int)cVar5;
    std::ostream::put(-0x60);
    std::ostream::flush();
    iVar23 = extraout_EDX;
    if (_header != (undefined **)&local_378) {
      uVar24 = local_378 + 1;
      operator_delete(_header,uVar24);
      iVar7 = (int)uVar24;
      iVar23 = extraout_EDX_00;
    }
    anon_unknown.dwarf_156c2f::fillPixels1(&p1,iVar7,iVar23);
    _out_5 = local_278;
    pcVar2 = (local_250->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out_5,pcVar2,pcVar2 + local_250->_M_string_length);
    std::__cxx11::string::append((char *)&out_5);
    local_2b0 = _out_5;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart file:",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)local_2b0);
    std::ofstream::ofstream(&os);
    plVar8 = local_2b0;
    std::filebuf::open((char *)local_230,(_Ios_Openmode)local_2b0);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,(char *)plVar8);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out,2,
               (allocator_type *)&header);
    __str._M_dataplus._M_p = (pointer)0x0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&__str,1.0,INCREASING_Y,local_39c);
    Imf_3_4::Header::operator=((Header *)_out,&header);
    Imf_3_4::Header::~Header(&header);
    local_380 = 5;
    local_378 = CONCAT26(local_378._6_2_,0x3174726170);
    _header = (undefined **)&local_378;
    Imf_3_4::Header::setName((string *)_out);
    if (_header != (undefined **)&local_378) {
      operator_delete(_header,local_378 + 1);
    }
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1b782b);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1b783e);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1b7851);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1c1019);
    Imf_3_4::Header::setType((string *)_out);
    Imf_3_4::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    local_380 = 5;
    local_378 = CONCAT26(local_378._6_2_,0x3274726170);
    _header = (undefined **)&local_378;
    Imf_3_4::Header::setName((string *)((long)_out + 0x38));
    if (_header != (undefined **)&local_378) {
      operator_delete(_header,local_378 + 1);
    }
    RVar4 = _out;
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&out_4,(OStream *)&ofs,(Header *)RVar4,2,false,iVar23);
    pRVar9 = p1._data;
    __str._M_string_length = __str._M_string_length & 0xffffffff00000000;
    __str.field_2._M_allocated_capacity = 0;
    __str.field_2._8_8_ = &__str._M_string_length;
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1b782b);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)&pRVar9->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1b783e);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)&pRVar9->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1b7851);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)&pRVar9->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1c1019);
    iVar23 = 0;
    do {
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&header,&out_4,iVar23);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_4::OutputPart::writePixels((int)(OutputPart *)&header);
      iVar23 = iVar23 + 1;
    } while (iVar23 == 1);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&__str);
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&out_4);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    _os = local_258;
    *(undefined8 *)(&os + *(long *)(local_258 + -0x18)) = local_260;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    plVar8 = local_2b0;
    std::filebuf::open(local_228,(_Ios_Openmode)local_2b0);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)plVar8);
    iVar23 = Imf_3_4::globalThreadCount();
    uVar17 = 1;
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&ofs,iVar23,true);
    iVar23 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar23 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1f8,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar14 = (undefined8 *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar15 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar23 = -(uint)((int)*puVar15 == (int)*puVar14);
    iVar7 = -(uint)((int)((ulong)*puVar15 >> 0x20) == (int)((ulong)*puVar14 >> 0x20));
    auVar36._4_4_ = iVar23;
    auVar36._0_4_ = iVar23;
    auVar36._8_4_ = iVar7;
    auVar36._12_4_ = iVar7;
    iVar23 = movmskpd(uVar17,auVar36);
    if ((iVar23 != 3) ||
       (iVar23 = -(uint)((int)puVar15[1] == (int)puVar14[1]),
       iVar7 = -(uint)((int)((ulong)puVar15[1] >> 0x20) == (int)((ulong)puVar14[1] >> 0x20)),
       auVar37._4_4_ = iVar23, auVar37._0_4_ = iVar23, auVar37._8_4_ = iVar7, auVar37._12_4_ = iVar7
       , iVar23 = movmskpd((int)puVar15,auVar37), iVar23 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1fa,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    piVar10 = (int *)Imf_3_4::Header::dataWindow();
    iVar23 = piVar10[2];
    lVar32 = (long)*piVar10;
    uVar24 = (iVar23 - lVar32) + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    __str._M_string_length = __str._M_string_length & 0xffffffff00000000;
    __str.field_2._M_allocated_capacity = 0;
    __str.field_2._8_8_ = &__str._M_string_length;
    lVar18 = (long)-iVar7 * uVar24;
    uVar26 = uVar24 * 8;
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8),8,uVar26,1,1
               ,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1b782b);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 2),8,uVar26
               ,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1b783e);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 4),8,uVar26
               ,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1b7851);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 6),8,uVar26
               ,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&__str,(Slice *)0x1c1019);
    lVar18 = p1._sizeY;
    iVar7 = 0;
    do {
      Imf_3_4::InputPart::InputPart((InputPart *)&header,(MultiPartInputFile *)&out,iVar7);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_4::InputPart::readPixels((int)&header,piVar10[1]);
      cVar5 = Imf_3_4::isLossyCompression(local_39c);
      if (cVar5 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar7);
        if (-1 < iVar6) {
          uVar11 = 0;
          lVar19 = (long)pvVar12 + 6;
          phVar21 = &pRVar9->a;
          do {
            if (-1 < (int)(iVar23 - lVar32)) {
              uVar27 = 0;
              do {
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + -6 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar21[uVar27 * 4 + -3]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x22e,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + -4 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar21[uVar27 * 4 + -2]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x22f,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + -2 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar21[uVar27 * 4 + -1]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x230,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar27 * 4]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x231,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar27 = uVar27 + 1;
              } while ((uVar24 & 0xffffffff) != uVar27);
            }
            uVar11 = uVar11 + 1;
            phVar21 = phVar21 + lVar18 * 4;
            lVar19 = lVar19 + uVar26;
          } while (uVar11 != uVar31);
        }
      }
      bVar33 = iVar7 == 0;
      iVar7 = iVar7 + 1;
    } while (bVar33);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&__str);
    operator_delete__(pvVar12);
    if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308);
    }
    if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
    }
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_156c2f::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)local_2b0);
    iVar23 = Imf_3_4::globalThreadCount();
    uVar17 = 1;
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&__str,(IStream *)&os,iVar23,true);
    iVar23 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar23 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x23d,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&__str);
    puVar14 = (undefined8 *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&__str);
    puVar15 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar23 = -(uint)((int)*puVar15 == (int)*puVar14);
    iVar7 = -(uint)((int)((ulong)*puVar15 >> 0x20) == (int)((ulong)*puVar14 >> 0x20));
    auVar38._4_4_ = iVar23;
    auVar38._0_4_ = iVar23;
    auVar38._8_4_ = iVar7;
    auVar38._12_4_ = iVar7;
    iVar23 = movmskpd(uVar17,auVar38);
    if ((iVar23 != 3) ||
       (iVar23 = -(uint)((int)puVar15[1] == (int)puVar14[1]),
       iVar7 = -(uint)((int)((ulong)puVar15[1] >> 0x20) == (int)((ulong)puVar14[1] >> 0x20)),
       auVar39._4_4_ = iVar23, auVar39._0_4_ = iVar23, auVar39._8_4_ = iVar7, auVar39._12_4_ = iVar7
       , iVar23 = movmskpd((int)puVar15,auVar39), iVar23 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x23f,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&__str);
    piVar10 = (int *)Imf_3_4::Header::dataWindow();
    iVar23 = piVar10[2];
    lVar32 = (long)*piVar10;
    uVar24 = (iVar23 - lVar32) + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    local_380 = local_380 & 0xffffffff00000000;
    local_378 = 0;
    local_370 = &local_380;
    local_360 = (ofstream *)0x0;
    lVar18 = (long)-iVar7 * uVar24;
    uVar26 = uVar24 * 8;
    local_368 = local_370;
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8),8,uVar26,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b782b);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 2),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b783e);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 4),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b7851);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 6),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1c1019);
    lVar18 = p1._sizeY;
    phVar21 = &(p1._data)->a;
    iVar7 = 0;
    do {
      Imf_3_4::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&__str,iVar7);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::InputPart::readPixels((int)&ofs,piVar10[1]);
      cVar5 = Imf_3_4::isLossyCompression(local_39c);
      if (cVar5 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar7);
        if (-1 < iVar6) {
          uVar11 = 0;
          lVar19 = (long)pvVar12 + 6;
          phVar20 = phVar21;
          do {
            if (-1 < (int)(iVar23 - lVar32)) {
              uVar27 = 0;
              do {
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + -6 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar20[uVar27 * 4 + -3]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x273,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + -4 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar20[uVar27 * 4 + -2]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x274,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + -2 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar20[uVar27 * 4 + -1]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x275,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar19 + uVar27 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar20[uVar27 * 4]._h * 4);
                if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x276,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar27 = uVar27 + 1;
              } while ((uVar24 & 0xffffffff) != uVar27);
            }
            uVar11 = uVar11 + 1;
            phVar20 = phVar20 + lVar18 * 4;
            lVar19 = lVar19 + uVar26;
          } while (uVar11 != uVar31);
        }
      }
      bVar33 = iVar7 == 0;
      iVar7 = iVar7 + 1;
    } while (bVar33);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    operator_delete__(pvVar12);
    if (__str.field_2._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str.field_2._8_8_);
    }
    if (__str._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_string_length);
    }
    anon_unknown.dwarf_156c2f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    remove((char *)local_2b0);
    if (_out_5 != local_278) {
      operator_delete(_out_5,local_278[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart stringstream:",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    __str._M_string_length = 0;
    __str.field_2._M_allocated_capacity = __str.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out,2,
               (allocator_type *)&ofs);
    _header = 0;
    hStack_386._h = 0;
    hStack_384._h = 0;
    hStack_382._h = 0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    Imf_3_4::Header::operator=((Header *)_out,(Header *)&ofs);
    Imf_3_4::Header::~Header((Header *)&ofs);
    uStack_2dc = 0x31;
    local_2e0 = 0x74726170;
    uStack_2db = 0;
    _ofs = (Rgba)&local_2e0;
    Imf_3_4::Header::setName((string *)_out);
    if (_ofs != (Rgba)&local_2e0) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2da,CONCAT15(uStack_2db,CONCAT14(uStack_2dc,local_2e0))) + 1);
    }
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1b782b);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1b783e);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1b7851);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1c1019);
    Imf_3_4::Header::setType((string *)_out);
    Imf_3_4::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    uStack_2dc = 0x32;
    local_2e0 = 0x74726170;
    uStack_2db = 0;
    _ofs = (Rgba)&local_2e0;
    Imf_3_4::Header::setName((string *)((long)_out + 0x38));
    if (_ofs != (Rgba)&local_2e0) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2da,CONCAT15(uStack_2db,CONCAT14(uStack_2dc,local_2e0))) + 1);
    }
    RVar4 = _out;
    iVar23 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&out_5,(OStream *)&os,(Header *)RVar4,2,false,iVar23);
    pRVar9 = p1._data;
    local_380 = local_380 & 0xffffffff00000000;
    local_378 = 0;
    local_370 = &local_380;
    local_360 = (ofstream *)0x0;
    local_368 = local_370;
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b782b);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)&pRVar9->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b783e);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)&pRVar9->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b7851);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)&pRVar9->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1c1019);
    iVar23 = 0;
    do {
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&ofs,&out_5,iVar23);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::OutputPart::writePixels((int)(OutputPart *)&ofs);
      iVar23 = iVar23 + 1;
    } while (iVar23 == 1);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&__str,(string *)&ofs);
    if (_ofs != (Rgba)&local_2e0) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2da,CONCAT15(uStack_2db,CONCAT14(uStack_2dc,local_2e0))) + 1);
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&out_5);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar23 = Imf_3_4::globalThreadCount();
    uVar17 = 1;
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&os,iVar23,true);
    iVar23 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar23 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x380,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar14 = (undefined8 *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&out);
    puVar15 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar23 = -(uint)((int)*puVar15 == (int)*puVar14);
    iVar7 = -(uint)((int)((ulong)*puVar15 >> 0x20) == (int)((ulong)*puVar14 >> 0x20));
    auVar40._4_4_ = iVar23;
    auVar40._0_4_ = iVar23;
    auVar40._8_4_ = iVar7;
    auVar40._12_4_ = iVar7;
    iVar23 = movmskpd(uVar17,auVar40);
    if ((iVar23 != 3) ||
       (iVar23 = -(uint)((int)puVar15[1] == (int)puVar14[1]),
       iVar7 = -(uint)((int)((ulong)puVar15[1] >> 0x20) == (int)((ulong)puVar14[1] >> 0x20)),
       auVar41._4_4_ = iVar23, auVar41._0_4_ = iVar23, auVar41._8_4_ = iVar7, auVar41._12_4_ = iVar7
       , iVar23 = movmskpd((int)puVar15,auVar41), iVar23 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x382,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    piVar10 = (int *)Imf_3_4::Header::dataWindow();
    iVar23 = piVar10[2];
    lVar32 = (long)*piVar10;
    uVar24 = (iVar23 - lVar32) + 1;
    iVar7 = piVar10[1];
    iVar6 = piVar10[3] - iVar7;
    uVar31 = iVar6 + 1;
    uVar11 = (long)(int)uVar31 * uVar24;
    uVar26 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar26);
    local_380 = local_380 & 0xffffffff00000000;
    local_378 = 0;
    local_370 = &local_380;
    local_360 = (ofstream *)0x0;
    lVar18 = (long)-iVar7 * uVar24;
    uVar26 = uVar24 * 8;
    local_368 = local_370;
    local_2b0 = (long *)pvVar12;
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8),8,uVar26,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b782b);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 2),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b783e);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 4),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1b7851);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar12 + lVar32 * -8 + lVar18 * 8 + 6),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1c1019);
    lVar18 = p1._sizeY;
    lVar19 = (long)local_2b0 + 6;
    iVar7 = 0;
    do {
      Imf_3_4::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&out,iVar7);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::InputPart::readPixels((int)&ofs,piVar10[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,", comparing pt ",0xf);
      std::ostream::operator<<(&std::cout,iVar7);
      if (-1 < iVar6) {
        uVar11 = 0;
        lVar29 = lVar19;
        phVar21 = &pRVar9->a;
        do {
          if (-1 < (int)(iVar23 - lVar32)) {
            uVar27 = 0;
            do {
              fVar34 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar29 + -6 + uVar27 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar27 * 4 + -3]._h * 4
                                );
              if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b4,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar34 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar29 + -4 + uVar27 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar27 * 4 + -2]._h * 4
                                );
              if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b5,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar34 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar29 + -2 + uVar27 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar27 * 4 + -1]._h * 4
                                );
              if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b6,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar34 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar29 + uVar27 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[uVar27 * 4]._h * 4);
              if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x3b7,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              uVar27 = uVar27 + 1;
            } while ((uVar24 & 0xffffffff) != uVar27);
          }
          uVar11 = uVar11 + 1;
          phVar21 = phVar21 + lVar18 * 4;
          lVar29 = lVar29 + uVar26;
        } while (uVar11 != uVar31);
      }
      bVar33 = iVar7 == 0;
      iVar7 = iVar7 + 1;
    } while (bVar33);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    operator_delete__(local_2b0);
    if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308);
    }
    if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
    }
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (p1._data != (Rgba *)0x0) {
      operator_delete__(p1._data);
    }
    local_39c = local_39c + RLE_COMPRESSION;
    if (local_39c == NUM_COMPRESSION_METHODS) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
                (tempDir + "imf_test_streams.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
                (tempDir + "imf_test_streams2.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
                (tempDir + "imf_test_streams3.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}